

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O3

void formatGestureHeader(QDebug *d,char *className,QGesture *gesture)

{
  char *pcVar1;
  double dVar2;
  int iVar3;
  storage_type *psVar4;
  long lVar5;
  storage_type *psVar6;
  Stream *this;
  QTextStream *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  undefined1 local_58 [16];
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (QTextStream *)d->stream;
  if (className == (char *)0x0) {
    psVar6 = (storage_type *)0x0;
  }
  else {
    psVar4 = (storage_type *)0xffffffffffffffff;
    do {
      psVar6 = psVar4 + 1;
      pcVar1 = className + 1 + (long)psVar4;
      psVar4 = psVar6;
    } while (*pcVar1 != '\0');
  }
  QVar8.m_data = psVar6;
  QVar8.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar7,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar7 = (QTextStream *)d->stream;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)d->stream;
  }
  QVar9.m_data = (storage_type *)0x7;
  QVar9.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar7,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (((QTextStream *)d->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)d->stream,' ');
  }
  iVar3 = *(int *)(*(long *)&gesture->field_0x8 + 0x7c);
  QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
  local_58 = QMetaObject::enumerator(0x832328);
  lVar5 = QMetaEnum::valueToKey((ulonglong)local_58);
  pQVar7 = (QTextStream *)d->stream;
  if (lVar5 == 0) {
    QTextStream::operator<<(pQVar7,iVar3);
    this = d->stream;
    if (this[0x30] != (Stream)0x1) goto LAB_002ce25a;
  }
  else {
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar6 + lVar5 + 1;
      psVar6 = psVar6 + 1;
    } while (*pcVar1 != '\0');
    QVar10.m_data = psVar6;
    QVar10.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<(pQVar7,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    this = d->stream;
    if (this[0x30] == (Stream)0x0) goto LAB_002ce25a;
  }
  QTextStream::operator<<((QTextStream *)this,' ');
LAB_002ce25a:
  if ((*(byte *)(*(long *)&gesture->field_0x8 + 0xa0) & 1) != 0) {
    pQVar7 = (QTextStream *)d->stream;
    QVar11.m_data = (storage_type *)0x9;
    QVar11.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<(pQVar7,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar7 = (QTextStream *)d->stream;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)d->stream;
    }
    dVar2 = *(double *)(*(long *)&gesture->field_0x8 + 0x88);
    QTextStream::operator<<(pQVar7,*(double *)(*(long *)&gesture->field_0x8 + 0x80));
    pQVar7 = (QTextStream *)d->stream;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)d->stream;
    }
    QTextStream::operator<<(pQVar7,',');
    pQVar7 = (QTextStream *)d->stream;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)d->stream;
    }
    QTextStream::operator<<(pQVar7,dVar2);
    if (((QTextStream *)d->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)d->stream,' ');
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void formatGestureHeader(QDebug d, const char *className, const QGesture *gesture)
{
     d << className << "(state=";
     QtDebugUtils::formatQEnum(d, gesture->state());
     if (gesture->hasHotSpot()) {
         d << ",hotSpot=";
         QtDebugUtils::formatQPoint(d, gesture->hotSpot());
     }
}